

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O0

void index_tree_append(index_tree *tree,index_tree_node *node)

{
  index_tree_node *piVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  index_tree_node *pivot;
  index_tree_node *piStack_18;
  uint32_t up;
  index_tree_node *node_local;
  index_tree *tree_local;
  
  node->parent = tree->rightmost;
  node->left = (index_tree_node *)0x0;
  node->right = (index_tree_node *)0x0;
  tree->count = tree->count + 1;
  if (tree->root == (index_tree_node *)0x0) {
    tree->root = node;
    tree->leftmost = node;
    tree->rightmost = node;
  }
  else {
    if (node->uncompressed_base < tree->rightmost->uncompressed_base) {
      __assert_fail("tree->rightmost->uncompressed_base <= node->uncompressed_base",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/common/index.c"
                    ,0xf9,"void index_tree_append(index_tree *, index_tree_node *)");
    }
    if (node->compressed_base <= tree->rightmost->compressed_base) {
      __assert_fail("tree->rightmost->compressed_base < node->compressed_base",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/common/index.c"
                    ,0xfa,"void index_tree_append(index_tree *, index_tree_node *)");
    }
    tree->rightmost->right = node;
    tree->rightmost = node;
    uVar3 = tree->count;
    uVar2 = bsr32(tree->count);
    if (uVar3 != 1 << ((byte)uVar2 & 0x1f)) {
      uVar3 = ctz32(tree->count);
      pivot._4_4_ = uVar3 + 2;
      piStack_18 = node;
      do {
        piStack_18 = piStack_18->parent;
        pivot._4_4_ = pivot._4_4_ + -1;
      } while (pivot._4_4_ != 0);
      piVar1 = piStack_18->right;
      if (piStack_18->parent == (index_tree_node *)0x0) {
        tree->root = piVar1;
      }
      else {
        if (piStack_18->parent->right != piStack_18) {
          __assert_fail("node->parent->right == node",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/common/index.c"
                        ,0x116,"void index_tree_append(index_tree *, index_tree_node *)");
        }
        piStack_18->parent->right = piVar1;
      }
      piVar1->parent = piStack_18->parent;
      piStack_18->right = piVar1->left;
      if (piStack_18->right != (index_tree_node *)0x0) {
        piStack_18->right->parent = piStack_18;
      }
      piVar1->left = piStack_18;
      piStack_18->parent = piVar1;
    }
  }
  return;
}

Assistant:

static void
index_tree_append(index_tree *tree, index_tree_node *node)
{
	uint32_t up;
	node->parent = tree->rightmost;
	node->left = NULL;
	node->right = NULL;

	++tree->count;

	// Handle the special case of adding the first node.
	if (tree->root == NULL) {
		tree->root = node;
		tree->leftmost = node;
		tree->rightmost = node;
		return;
	}

	// The tree is always filled sequentially.
	assert(tree->rightmost->uncompressed_base <= node->uncompressed_base);
	assert(tree->rightmost->compressed_base < node->compressed_base);

	// Add the new node after the rightmost node. It's the correct
	// place due to the reason above.
	tree->rightmost->right = node;
	tree->rightmost = node;

	// Balance the AVL-tree if needed. We don't need to keep the balance
	// factors in nodes, because we always fill the tree sequentially,
	// and thus know the state of the tree just by looking at the node
	// count. From the node count we can calculate how many steps to go
	// up in the tree to find the rotation root.
	up = tree->count ^ (UINT32_C(1) << bsr32(tree->count));
	if (up != 0) {
		index_tree_node *pivot;

		// Locate the root node for the rotation.
		up = ctz32(tree->count) + 2;
		do {
			node = node->parent;
		} while (--up > 0);

		// Rotate left using node as the rotation root.
		pivot = node->right;

		if (node->parent == NULL) {
			tree->root = pivot;
		} else {
			assert(node->parent->right == node);
			node->parent->right = pivot;
		}

		pivot->parent = node->parent;

		node->right = pivot->left;
		if (node->right != NULL)
			node->right->parent = node;

		pivot->left = node;
		node->parent = pivot;
	}

	return;
}